

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::SubdivPatch1MBIntersectorK<4>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  GridSOA *pGVar1;
  GridSOA *pGVar2;
  GridSOA *pGVar3;
  GridSOA *pGVar4;
  float *pfVar5;
  GridSOA *pGVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int iVar14;
  float fVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  GridSOA *pGVar19;
  Geometry *pGVar20;
  RTCFilterFunctionN p_Var21;
  GridSOA *pGVar22;
  size_t sVar23;
  long lVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  AABBNodeMB4D *node1;
  ulong uVar36;
  uint uVar37;
  int iVar38;
  ulong uVar39;
  GridSOA *pGVar40;
  uint uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  GridSOA *pGVar45;
  GridSOA *pGVar46;
  GridSOA *pGVar47;
  GridSOA *pGVar48;
  NodeRef *pNVar49;
  NodeRef *pNVar50;
  GridSOA *pGVar51;
  GridSOA *pGVar52;
  ulong uVar53;
  float fVar54;
  float fVar55;
  uint uVar56;
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  float fVar75;
  float fVar77;
  float fVar78;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint uVar76;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar79;
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  float fVar90;
  undefined1 in_XMM1 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar91;
  float fVar92;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar93;
  float fVar100;
  float fVar101;
  undefined1 auVar94 [16];
  float fVar102;
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar103;
  float fVar107;
  float fVar108;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar109;
  undefined1 auVar106 [16];
  float fVar110;
  float fVar111;
  float fVar114;
  float fVar115;
  undefined1 auVar112 [16];
  float fVar116;
  undefined1 auVar113 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar156;
  float fVar162;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar163;
  float fVar168;
  float fVar169;
  undefined1 auVar164 [16];
  float fVar170;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float old_t_1;
  float fStack_b54;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b28;
  undefined8 local_b18;
  float old_t;
  float fStack_ae4;
  float local_a58;
  float fStack_a54;
  undefined1 local_a48 [16];
  Precalculations *local_a38;
  GridSOA *local_a30;
  ulong local_a28;
  ulong local_a20;
  undefined1 local_a18 [8];
  float fStack_a10;
  float fStack_a0c;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  undefined1 (*local_9f8) [16];
  ulong local_9f0;
  RTCFilterFunctionNArguments args;
  undefined8 local_9a8;
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined4 local_8a8;
  undefined4 uStack_8a4;
  undefined4 uStack_8a0;
  undefined4 uStack_89c;
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined4 local_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined1 local_868 [16];
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  uint local_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint local_828;
  uint uStack_824;
  uint uStack_820;
  uint uStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  NodeRef stack [244];
  undefined1 auVar96 [16];
  undefined1 auVar99 [16];
  
  stack[0] = root;
  fVar8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar9 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar10 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar11 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar12 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar13 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar53 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar14 = (tray->tnear).field_0.i[k];
  auVar164._4_4_ = iVar14;
  auVar164._0_4_ = iVar14;
  auVar164._8_4_ = iVar14;
  auVar164._12_4_ = iVar14;
  iVar14 = (tray->tfar).field_0.i[k];
  local_9f8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  pNVar50 = stack + 1;
  local_a38 = pre;
LAB_0072e156:
  pNVar49 = pNVar50;
  if (pNVar49 == stack) {
LAB_0072fd32:
    return pNVar49 != stack;
  }
  pNVar50 = pNVar49 + -1;
  uVar39 = pNVar49[-1].ptr;
  while ((uVar39 & 8) == 0) {
    uVar36 = uVar39 & 0xfffffffffffffff0;
    fVar54 = *(float *)(ray + k * 4 + 0x70);
    pfVar7 = (float *)(uVar36 + 0x80 + uVar44);
    pfVar5 = (float *)(uVar36 + 0x20 + uVar44);
    auVar82._0_4_ = ((*pfVar7 * fVar54 + *pfVar5) - fVar8) * fVar11;
    auVar82._4_4_ = ((pfVar7[1] * fVar54 + pfVar5[1]) - fVar8) * fVar11;
    auVar82._8_4_ = ((pfVar7[2] * fVar54 + pfVar5[2]) - fVar8) * fVar11;
    auVar82._12_4_ = ((pfVar7[3] * fVar54 + pfVar5[3]) - fVar8) * fVar11;
    auVar82 = maxps(auVar164,auVar82);
    pfVar7 = (float *)(uVar36 + 0x80 + uVar43);
    pfVar5 = (float *)(uVar36 + 0x20 + uVar43);
    auVar94._0_4_ = ((*pfVar7 * fVar54 + *pfVar5) - fVar9) * fVar12;
    auVar94._4_4_ = ((pfVar7[1] * fVar54 + pfVar5[1]) - fVar9) * fVar12;
    auVar94._8_4_ = ((pfVar7[2] * fVar54 + pfVar5[2]) - fVar9) * fVar12;
    auVar94._12_4_ = ((pfVar7[3] * fVar54 + pfVar5[3]) - fVar9) * fVar12;
    pfVar7 = (float *)(uVar36 + 0x80 + uVar53);
    pfVar5 = (float *)(uVar36 + 0x20 + uVar53);
    auVar144._0_4_ = ((*pfVar7 * fVar54 + *pfVar5) - fVar10) * fVar13;
    auVar144._4_4_ = ((pfVar7[1] * fVar54 + pfVar5[1]) - fVar10) * fVar13;
    auVar144._8_4_ = ((pfVar7[2] * fVar54 + pfVar5[2]) - fVar10) * fVar13;
    auVar144._12_4_ = ((pfVar7[3] * fVar54 + pfVar5[3]) - fVar10) * fVar13;
    auVar94 = maxps(auVar94,auVar144);
    auVar82 = maxps(auVar82,auVar94);
    pfVar7 = (float *)(uVar36 + 0x80 + (uVar44 ^ 0x10));
    pfVar5 = (float *)(uVar36 + 0x20 + (uVar44 ^ 0x10));
    auVar159._0_4_ = ((*pfVar7 * fVar54 + *pfVar5) - fVar8) * fVar11;
    auVar159._4_4_ = ((pfVar7[1] * fVar54 + pfVar5[1]) - fVar8) * fVar11;
    auVar159._8_4_ = ((pfVar7[2] * fVar54 + pfVar5[2]) - fVar8) * fVar11;
    auVar159._12_4_ = ((pfVar7[3] * fVar54 + pfVar5[3]) - fVar8) * fVar11;
    auVar105._4_4_ = iVar14;
    auVar105._0_4_ = iVar14;
    auVar105._8_4_ = iVar14;
    auVar105._12_4_ = iVar14;
    auVar94 = minps(auVar105,auVar159);
    pfVar7 = (float *)(uVar36 + 0x80 + (uVar43 ^ 0x10));
    pfVar5 = (float *)(uVar36 + 0x20 + (uVar43 ^ 0x10));
    auVar104._0_4_ = ((*pfVar7 * fVar54 + *pfVar5) - fVar9) * fVar12;
    auVar104._4_4_ = ((pfVar7[1] * fVar54 + pfVar5[1]) - fVar9) * fVar12;
    auVar104._8_4_ = ((pfVar7[2] * fVar54 + pfVar5[2]) - fVar9) * fVar12;
    auVar104._12_4_ = ((pfVar7[3] * fVar54 + pfVar5[3]) - fVar9) * fVar12;
    pfVar7 = (float *)(uVar36 + 0x80 + (uVar53 ^ 0x10));
    pfVar5 = (float *)(uVar36 + 0x20 + (uVar53 ^ 0x10));
    auVar112._0_4_ = ((*pfVar7 * fVar54 + *pfVar5) - fVar10) * fVar13;
    auVar112._4_4_ = ((pfVar7[1] * fVar54 + pfVar5[1]) - fVar10) * fVar13;
    auVar112._8_4_ = ((pfVar7[2] * fVar54 + pfVar5[2]) - fVar10) * fVar13;
    auVar112._12_4_ = ((pfVar7[3] * fVar54 + pfVar5[3]) - fVar10) * fVar13;
    auVar105 = minps(auVar104,auVar112);
    auVar94 = minps(auVar94,auVar105);
    uVar37 = (uint)uVar39 & 7;
    bVar25 = auVar82._0_4_ <= auVar94._0_4_;
    bVar26 = auVar82._4_4_ <= auVar94._4_4_;
    bVar27 = auVar82._8_4_ <= auVar94._8_4_;
    bVar28 = auVar82._12_4_ <= auVar94._12_4_;
    if (uVar37 == 6) {
      bVar25 = (fVar54 < *(float *)(uVar36 + 0xf0) && *(float *)(uVar36 + 0xe0) <= fVar54) && bVar25
      ;
      bVar26 = (fVar54 < *(float *)(uVar36 + 0xf4) && *(float *)(uVar36 + 0xe4) <= fVar54) && bVar26
      ;
      bVar27 = (fVar54 < *(float *)(uVar36 + 0xf8) && *(float *)(uVar36 + 0xe8) <= fVar54) && bVar27
      ;
      bVar28 = (fVar54 < *(float *)(uVar36 + 0xfc) && *(float *)(uVar36 + 0xec) <= fVar54) && bVar28
      ;
    }
    in_XMM1._0_4_ = (float)((uint)bVar25 * -0x80000000);
    in_XMM1._4_4_ = (float)((uint)bVar26 * -0x80000000);
    in_XMM1._8_4_ = (float)((uint)bVar27 * -0x80000000);
    in_XMM1._12_4_ = (float)((uint)bVar28 * -0x80000000);
    uVar37 = movmskps(uVar37,in_XMM1);
    if (uVar37 == 0) goto LAB_0072e156;
    uVar37 = uVar37 & 0xff;
    lVar24 = 0;
    if (uVar37 != 0) {
      for (; (uVar37 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
      }
    }
    uVar39 = *(ulong *)(uVar36 + lVar24 * 8);
    uVar37 = uVar37 - 1 & uVar37;
    uVar42 = (ulong)uVar37;
    if (uVar37 != 0) {
      do {
        pNVar50->ptr = uVar39;
        pNVar50 = pNVar50 + 1;
        lVar24 = 0;
        if (uVar42 != 0) {
          for (; (uVar42 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
          }
        }
        uVar39 = *(ulong *)(uVar36 + lVar24 * 8);
        uVar42 = uVar42 - 1 & uVar42;
      } while (uVar42 != 0);
    }
  }
  if (((uint)uVar39 & 0xf) != 8) {
    sVar23 = *(size_t *)*(GridSOA **)(uVar39 & 0xfffffffffffffff0);
    (local_a38->super_Precalculations).grid = *(GridSOA **)(uVar39 & 0xfffffffffffffff0);
    if (sVar23 != 0) {
      pNVar50->ptr = sVar23;
      pNVar50 = pNVar50 + 1;
    }
    goto LAB_0072e156;
  }
  pGVar19 = (local_a38->super_Precalculations).grid;
  fStack_a04 = *(float *)(ray + k * 4 + 0x70) * (float)(*(int *)(pGVar19 + 8) - 1);
  auVar83 = roundss(in_XMM1,ZEXT416((uint)fStack_a04),9);
  fVar54 = (float)(*(int *)(pGVar19 + 8) - 1) + -1.0;
  if (fVar54 <= auVar83._0_4_) {
    auVar83._0_4_ = fVar54;
  }
  fVar54 = 0.0;
  if (0.0 <= auVar83._0_4_) {
    fVar54 = auVar83._0_4_;
  }
  uVar37 = *(uint *)(pGVar19 + 0xc);
  uVar36 = (ulong)uVar37;
  lVar24 = (long)(int)fVar54 * (ulong)*(uint *)(pGVar19 + 0x28) + (ulong)*(uint *)(pGVar19 + 0x24);
  uVar39 = uVar39 >> 4;
  pGVar1 = pGVar19 + uVar39 * 4 + lVar24;
  pGVar40 = pGVar19 + uVar39 * 4 + lVar24 + 0x2c;
  fVar111 = *(float *)(pGVar40 + 4);
  pGVar6 = pGVar1 + uVar36 * 4 + 0x2c;
  fVar55 = *(float *)(pGVar6 + 4);
  fVar75 = *(float *)(pGVar40 + 8);
  fVar77 = *(float *)(pGVar6 + 8);
  if (uVar36 == 2) {
    fVar75 = fVar111;
    fVar77 = fVar55;
  }
  uVar42 = (ulong)*(uint *)(pGVar19 + 0x14);
  pGVar51 = pGVar1 + uVar42 * 4 + 0x2c;
  fVar93 = *(float *)(pGVar1 + uVar42 * 4 + 0x30);
  pGVar22 = pGVar51 + uVar36 * 4;
  fVar100 = *(float *)(pGVar22 + 4);
  fVar101 = *(float *)(pGVar1 + uVar42 * 4 + 0x34);
  fVar102 = *(float *)(pGVar22 + 8);
  if (uVar36 == 2) {
    fVar101 = fVar93;
    fVar102 = fVar100;
  }
  pGVar46 = pGVar1 + uVar42 * 8 + 0x2c;
  fVar103 = *(float *)(pGVar1 + uVar42 * 8 + 0x30);
  pGVar2 = pGVar46 + uVar36 * 4;
  fVar110 = *(float *)(pGVar2 + 4);
  fVar107 = *(float *)(pGVar1 + uVar42 * 8 + 0x34);
  fVar114 = *(float *)(pGVar2 + 8);
  if (uVar36 == 2) {
    fVar107 = fVar103;
    fVar114 = fVar110;
  }
  lVar24 = uVar39 * 4 + lVar24 + 0x2c;
  uVar39 = (ulong)(*(uint *)(pGVar19 + 0x28) & 0xfffffffc);
  pGVar3 = pGVar19 + uVar39 + lVar24;
  fVar108 = *(float *)(pGVar3 + 4);
  pGVar4 = pGVar19 + uVar36 * 4 + uVar39 + lVar24;
  fVar115 = *(float *)(pGVar4 + 4);
  fVar116 = *(float *)(pGVar3 + 8);
  fVar121 = *(float *)(pGVar4 + 8);
  if (uVar36 == 2) {
    fVar116 = fVar108;
    fVar121 = fVar115;
  }
  pGVar52 = pGVar51 + uVar39;
  fVar122 = *(float *)(pGVar52 + 4);
  pGVar48 = pGVar52 + uVar36 * 4;
  fVar124 = *(float *)(pGVar48 + 4);
  fVar125 = *(float *)(pGVar52 + 8);
  fVar127 = *(float *)(pGVar48 + 8);
  if (uVar36 == 2) {
    fVar125 = fVar122;
    fVar127 = fVar124;
  }
  fStack_a04 = fStack_a04 - fVar54;
  pGVar47 = pGVar46 + uVar39;
  fVar54 = *(float *)(pGVar47 + 4);
  pGVar45 = pGVar47 + uVar36 * 4;
  fVar128 = *(float *)(pGVar45 + 4);
  fVar130 = *(float *)(pGVar47 + 8);
  fVar131 = *(float *)(pGVar45 + 8);
  if (uVar36 == 2) {
    fVar130 = fVar54;
    fVar131 = fVar128;
  }
  local_a20 = (ulong)*(uint *)(pGVar19 + 0x10);
  local_a30 = pGVar1 + uVar42 * 0xc + 0x2c;
  local_808 = 1.0 - fStack_a04;
  local_a08 = fStack_a04;
  fStack_a00 = fStack_a04;
  fStack_9fc = fStack_a04;
  old_t = (float)*(undefined8 *)pGVar4;
  fStack_ae4 = (float)((ulong)*(undefined8 *)pGVar4 >> 0x20);
  local_a58 = (float)*(undefined8 *)pGVar22;
  fStack_a54 = (float)((ulong)*(undefined8 *)pGVar22 >> 0x20);
  fStack_804 = local_808;
  fStack_800 = local_808;
  fStack_7fc = local_808;
  local_b48._0_4_ = (float)*(undefined8 *)pGVar2;
  local_b48._4_4_ = (float)((ulong)*(undefined8 *)pGVar2 >> 0x20);
  fVar109 = *(float *)(ray + k * 4);
  fVar78 = *(float *)(ray + k * 4 + 0x10);
  fVar174 = *(float *)(ray + k * 4 + 0x20);
  fVar15 = *(float *)(ray + k * 4 + 0x40);
  fVar138 = (*(float *)pGVar40 * local_808 + *(float *)pGVar3 * fStack_a04) - fVar109;
  fVar147 = (*(float *)pGVar6 * local_808 + *(float *)pGVar4 * fStack_a04) - fVar109;
  fVar150 = (fVar111 * local_808 + fVar108 * fStack_a04) - fVar109;
  fVar153 = (fVar55 * local_808 + fVar115 * fStack_a04) - fVar109;
  fVar79 = (*(float *)pGVar51 * local_808 + *(float *)pGVar52 * fStack_a04) - fVar78;
  fVar90 = (*(float *)pGVar22 * local_808 + *(float *)pGVar48 * fStack_a04) - fVar78;
  fVar91 = (fVar93 * local_808 + fVar122 * fStack_a04) - fVar78;
  fVar92 = (fVar100 * local_808 + fVar124 * fStack_a04) - fVar78;
  fVar191 = (*(float *)pGVar46 * local_808 + *(float *)pGVar47 * fStack_a04) - fVar174;
  fVar192 = (*(float *)pGVar2 * local_808 + *(float *)pGVar45 * fStack_a04) - fVar174;
  fVar193 = (fVar103 * local_808 + fVar54 * fStack_a04) - fVar174;
  fVar194 = (fVar110 * local_808 + fVar128 * fStack_a04) - fVar174;
  fVar175 = (fVar111 * local_808 + fVar108 * fStack_a04) - fVar109;
  fVar178 = (fVar111 * local_808 + fVar108 * fStack_a04) - fVar109;
  fVar181 = (fVar75 * local_808 + fVar116 * fStack_a04) - fVar109;
  fVar184 = (fVar75 * local_808 + fVar116 * fStack_a04) - fVar109;
  fVar120 = (fVar93 * local_808 + fVar122 * fStack_a04) - fVar78;
  fVar123 = (fVar93 * local_808 + fVar122 * fStack_a04) - fVar78;
  fVar126 = (fVar101 * local_808 + fVar125 * fStack_a04) - fVar78;
  fVar129 = (fVar101 * local_808 + fVar125 * fStack_a04) - fVar78;
  fVar132 = (fVar103 * local_808 + fVar54 * fStack_a04) - fVar174;
  fVar135 = (fVar103 * local_808 + fVar54 * fStack_a04) - fVar174;
  fVar136 = (fVar107 * local_808 + fVar130 * fStack_a04) - fVar174;
  fVar137 = (fVar107 * local_808 + fVar130 * fStack_a04) - fVar174;
  fVar103 = (*(float *)pGVar6 * local_808 + old_t * fStack_a04) - fVar109;
  fVar107 = (fVar55 * local_808 + fStack_ae4 * fStack_a04) - fVar109;
  fVar108 = (fVar55 * local_808 + fVar115 * fStack_a04) - fVar109;
  fVar109 = (fVar77 * local_808 + fVar121 * fStack_a04) - fVar109;
  fVar55 = (local_a58 * local_808 + *(float *)pGVar48 * fStack_a04) - fVar78;
  fVar75 = (fStack_a54 * local_808 + fVar124 * fStack_a04) - fVar78;
  fVar77 = (fVar100 * local_808 + fVar124 * fStack_a04) - fVar78;
  fVar78 = (fVar102 * local_808 + fVar127 * fStack_a04) - fVar78;
  fVar171 = ((float)local_b48 * local_808 + *(float *)pGVar45 * fStack_a04) - fVar174;
  fVar172 = (local_b48._4_4_ * local_808 + fVar128 * fStack_a04) - fVar174;
  fVar173 = (fVar110 * local_808 + fVar128 * fStack_a04) - fVar174;
  fVar174 = (fVar114 * local_808 + fVar131 * fStack_a04) - fVar174;
  fVar163 = fVar103 - fVar138;
  fVar168 = fVar107 - fVar147;
  fVar169 = fVar108 - fVar150;
  fVar170 = fVar109 - fVar153;
  fVar139 = fVar55 - fVar79;
  fVar148 = fVar75 - fVar90;
  fVar151 = fVar77 - fVar91;
  fVar154 = fVar78 - fVar92;
  fVar176 = fVar171 - fVar191;
  fVar179 = fVar172 - fVar192;
  fVar182 = fVar173 - fVar193;
  fVar185 = fVar174 - fVar194;
  fVar54 = *(float *)(ray + k * 4 + 0x50);
  fVar111 = *(float *)(ray + k * 4 + 0x60);
  fVar140 = fVar138 - fVar175;
  fVar149 = fVar147 - fVar178;
  fVar152 = fVar150 - fVar181;
  fVar155 = fVar153 - fVar184;
  fVar156 = (fVar139 * (fVar171 + fVar191) - (fVar55 + fVar79) * fVar176) * fVar15 +
            ((fVar103 + fVar138) * fVar176 - (fVar171 + fVar191) * fVar163) * fVar54 +
            (fVar163 * (fVar55 + fVar79) - (fVar103 + fVar138) * fVar139) * fVar111;
  fVar162 = (fVar148 * (fVar172 + fVar192) - (fVar75 + fVar90) * fVar179) * fVar15 +
            ((fVar107 + fVar147) * fVar179 - (fVar172 + fVar192) * fVar168) * fVar54 +
            (fVar168 * (fVar75 + fVar90) - (fVar107 + fVar147) * fVar148) * fVar111;
  local_a18 = (undefined1  [8])CONCAT44(fVar162,fVar156);
  fStack_a10 = (fVar151 * (fVar173 + fVar193) - (fVar77 + fVar91) * fVar182) * fVar15 +
               ((fVar108 + fVar150) * fVar182 - (fVar173 + fVar193) * fVar169) * fVar54 +
               (fVar169 * (fVar77 + fVar91) - (fVar108 + fVar150) * fVar151) * fVar111;
  fStack_a0c = (fVar154 * (fVar174 + fVar194) - (fVar78 + fVar92) * fVar185) * fVar15 +
               ((fVar109 + fVar153) * fVar185 - (fVar174 + fVar194) * fVar170) * fVar54 +
               (fVar170 * (fVar78 + fVar92) - (fVar109 + fVar153) * fVar154) * fVar111;
  fVar121 = fVar79 - fVar120;
  fVar124 = fVar90 - fVar123;
  fVar127 = fVar91 - fVar126;
  fVar130 = fVar92 - fVar129;
  fVar93 = fVar191 - fVar132;
  fVar100 = fVar192 - fVar135;
  fVar101 = fVar193 - fVar136;
  fVar102 = fVar194 - fVar137;
  fVar177 = (fVar121 * (fVar191 + fVar132) - (fVar79 + fVar120) * fVar93) * fVar15 +
            ((fVar138 + fVar175) * fVar93 - (fVar191 + fVar132) * fVar140) * fVar54 +
            (fVar140 * (fVar79 + fVar120) - (fVar138 + fVar175) * fVar121) * fVar111;
  fVar180 = (fVar124 * (fVar192 + fVar135) - (fVar90 + fVar123) * fVar100) * fVar15 +
            ((fVar147 + fVar178) * fVar100 - (fVar192 + fVar135) * fVar149) * fVar54 +
            (fVar149 * (fVar90 + fVar123) - (fVar147 + fVar178) * fVar124) * fVar111;
  fVar183 = (fVar127 * (fVar193 + fVar136) - (fVar91 + fVar126) * fVar101) * fVar15 +
            ((fVar150 + fVar181) * fVar101 - (fVar193 + fVar136) * fVar152) * fVar54 +
            (fVar152 * (fVar91 + fVar126) - (fVar150 + fVar181) * fVar127) * fVar111;
  fVar186 = (fVar130 * (fVar194 + fVar137) - (fVar92 + fVar129) * fVar102) * fVar15 +
            ((fVar153 + fVar184) * fVar102 - (fVar194 + fVar137) * fVar155) * fVar54 +
            (fVar155 * (fVar92 + fVar129) - (fVar153 + fVar184) * fVar130) * fVar111;
  fVar110 = fVar175 - fVar103;
  fVar114 = fVar178 - fVar107;
  fVar115 = fVar181 - fVar108;
  fVar116 = fVar184 - fVar109;
  fVar187 = fVar120 - fVar55;
  fVar188 = fVar123 - fVar75;
  fVar189 = fVar126 - fVar77;
  fVar190 = fVar129 - fVar78;
  fVar122 = fVar132 - fVar171;
  fVar125 = fVar135 - fVar172;
  fVar128 = fVar136 - fVar173;
  fVar131 = fVar137 - fVar174;
  auVar165._4_4_ = fVar180;
  auVar165._0_4_ = fVar177;
  auVar165._8_4_ = fVar183;
  auVar165._12_4_ = fVar186;
  auVar84._0_4_ =
       (fVar187 * (fVar171 + fVar132) - (fVar55 + fVar120) * fVar122) * fVar15 +
       ((fVar103 + fVar175) * fVar122 - (fVar171 + fVar132) * fVar110) * fVar54 +
       (fVar110 * (fVar55 + fVar120) - (fVar103 + fVar175) * fVar187) * fVar111;
  auVar84._4_4_ =
       (fVar188 * (fVar172 + fVar135) - (fVar75 + fVar123) * fVar125) * fVar15 +
       ((fVar107 + fVar178) * fVar125 - (fVar172 + fVar135) * fVar114) * fVar54 +
       (fVar114 * (fVar75 + fVar123) - (fVar107 + fVar178) * fVar188) * fVar111;
  auVar84._8_4_ =
       (fVar189 * (fVar173 + fVar136) - (fVar77 + fVar126) * fVar128) * fVar15 +
       ((fVar108 + fVar181) * fVar128 - (fVar173 + fVar136) * fVar115) * fVar54 +
       (fVar115 * (fVar77 + fVar126) - (fVar108 + fVar181) * fVar189) * fVar111;
  auVar84._12_4_ =
       (fVar190 * (fVar174 + fVar137) - (fVar78 + fVar129) * fVar131) * fVar15 +
       ((fVar109 + fVar184) * fVar131 - (fVar174 + fVar137) * fVar116) * fVar54 +
       (fVar116 * (fVar78 + fVar129) - (fVar109 + fVar184) * fVar190) * fVar111;
  fVar77 = fVar156 + fVar177 + auVar84._0_4_;
  fVar103 = fVar162 + fVar180 + auVar84._4_4_;
  fVar107 = fStack_a10 + fVar183 + auVar84._8_4_;
  fVar108 = fStack_a0c + fVar186 + auVar84._12_4_;
  auVar59._8_4_ = fStack_a10;
  auVar59._0_8_ = local_a18;
  auVar59._12_4_ = fStack_a0c;
  auVar82 = minps(auVar59,auVar165);
  auVar82 = minps(auVar82,auVar84);
  auVar141._8_4_ = fStack_a10;
  auVar141._0_8_ = local_a18;
  auVar141._12_4_ = fStack_a0c;
  auVar94 = maxps(auVar141,auVar165);
  auVar94 = maxps(auVar94,auVar84);
  local_818 = ABS(fVar77);
  fStack_814 = ABS(fVar103);
  fStack_810 = ABS(fVar107);
  fStack_80c = ABS(fVar108);
  fVar55 = local_818 * 1.1920929e-07;
  fVar75 = fStack_814 * 1.1920929e-07;
  auVar142._4_4_ = -(uint)(auVar94._4_4_ <= fVar75);
  auVar142._0_4_ = -(uint)(auVar94._0_4_ <= fVar55);
  auVar142._8_4_ = -(uint)(auVar94._8_4_ <= fStack_810 * 1.1920929e-07);
  auVar142._12_4_ = -(uint)(auVar94._12_4_ <= fStack_80c * 1.1920929e-07);
  in_XMM1._0_8_ = CONCAT44(fVar75,fVar55) ^ 0x8000000080000000;
  in_XMM1._8_4_ = -(fStack_810 * 1.1920929e-07);
  in_XMM1._12_4_ = -(fStack_80c * 1.1920929e-07);
  auVar60._4_4_ = -(uint)(-fVar75 <= auVar82._4_4_);
  auVar60._0_4_ = -(uint)(-fVar55 <= auVar82._0_4_);
  auVar60._8_4_ = -(uint)(in_XMM1._8_4_ <= auVar82._8_4_);
  auVar60._12_4_ = -(uint)(in_XMM1._12_4_ <= auVar82._12_4_);
  auVar142 = auVar142 | auVar60;
  iVar38 = movmskps(uVar37,auVar142);
  local_9f0 = local_a20;
  if (iVar38 == 0) {
LAB_0072effc:
    if ((uint)local_9f0 < 3) goto LAB_0072e156;
    pGVar40 = pGVar1 + uVar36 * 4 + 0x2c;
    fVar54 = *(float *)(pGVar1 + uVar36 * 4 + 0x30);
    pGVar19 = pGVar40 + uVar36 * 4;
    fVar111 = *(float *)(pGVar19 + 4);
    fVar55 = *(float *)(pGVar1 + uVar36 * 4 + 0x34);
    fVar75 = *(float *)(pGVar19 + 8);
    if (uVar36 == 2) {
      fVar55 = fVar54;
      fVar75 = fVar111;
    }
    pGVar22 = (local_a38->super_Precalculations).grid;
    uVar39 = (ulong)*(uint *)(pGVar22 + 0x14);
    pGVar1 = pGVar40 + uVar39 * 4;
    fVar77 = *(float *)(pGVar1 + 4);
    pGVar6 = pGVar1 + uVar36 * 4;
    fVar93 = *(float *)(pGVar6 + 4);
    fVar100 = *(float *)(pGVar1 + 8);
    fVar101 = *(float *)(pGVar6 + 8);
    if (uVar36 == 2) {
      fVar100 = fVar77;
      fVar101 = fVar93;
    }
    pGVar51 = pGVar40 + uVar39 * 8;
    fVar102 = *(float *)(pGVar51 + 4);
    pGVar2 = pGVar51 + uVar36 * 4;
    fVar103 = *(float *)(pGVar2 + 4);
    fVar110 = *(float *)(pGVar51 + 8);
    fVar107 = *(float *)(pGVar2 + 8);
    if (uVar36 == 2) {
      fVar110 = fVar102;
      fVar107 = fVar103;
    }
    uVar42 = (ulong)(*(uint *)(pGVar22 + 0x28) & 0xfffffffc);
    pGVar46 = pGVar40 + uVar42;
    fVar114 = *(float *)(pGVar46 + 4);
    pGVar3 = pGVar40 + uVar36 * 4 + uVar42;
    fVar108 = *(float *)(pGVar3 + 4);
    fVar115 = *(float *)(pGVar46 + 8);
    fVar116 = *(float *)(pGVar3 + 8);
    if (uVar36 == 2) {
      fVar115 = fVar114;
      fVar116 = fVar108;
    }
    pGVar48 = pGVar1 + uVar42;
    fVar121 = *(float *)(pGVar48 + 4);
    pGVar4 = pGVar48 + uVar36 * 4;
    fVar122 = *(float *)(pGVar4 + 4);
    fVar124 = *(float *)(pGVar4 + 8);
    fVar125 = *(float *)(pGVar48 + 8);
    if (uVar36 == 2) {
      fVar124 = fVar122;
      fVar125 = fVar121;
    }
    pGVar45 = pGVar51 + uVar42;
    fVar127 = *(float *)(pGVar45 + 4);
    pGVar52 = pGVar45 + uVar36 * 4;
    fVar128 = *(float *)(pGVar52 + 4);
    fVar130 = *(float *)(pGVar45 + 8);
    fVar131 = *(float *)(pGVar52 + 8);
    if (uVar36 == 2) {
      fVar130 = fVar127;
      fVar131 = fVar128;
    }
    local_a30 = pGVar40 + uVar39 * 0xc;
    local_b48._0_4_ = (float)*(undefined8 *)pGVar6;
    local_b48._4_4_ = (float)((ulong)*(undefined8 *)pGVar6 >> 0x20);
    old_t_1 = (float)*(undefined8 *)pGVar2;
    fStack_b54 = (float)((ulong)*(undefined8 *)pGVar2 >> 0x20);
    local_a20 = local_9f0;
    fVar109 = *(float *)(ray + k * 4);
    fVar78 = *(float *)(ray + k * 4 + 0x10);
    fVar174 = *(float *)(ray + k * 4 + 0x20);
    fVar15 = *(float *)(ray + k * 4 + 0x40);
    fVar79 = *(float *)(ray + k * 4 + 0x50);
    fVar185 = (*(float *)pGVar40 * local_808 + *(float *)pGVar46 * local_a08) - fVar109;
    fVar187 = (*(float *)pGVar19 * fStack_804 + *(float *)pGVar3 * fStack_a04) - fVar109;
    fVar189 = (fVar54 * fStack_800 + fVar114 * fStack_a00) - fVar109;
    fVar191 = (fVar111 * fStack_7fc + fVar108 * fStack_9fc) - fVar109;
    fVar123 = (*(float *)pGVar1 * local_808 + *(float *)pGVar48 * local_a08) - fVar78;
    fVar126 = (*(float *)pGVar6 * fStack_804 + *(float *)pGVar4 * fStack_a04) - fVar78;
    fVar129 = (fVar77 * fStack_800 + fVar121 * fStack_a00) - fVar78;
    fVar132 = (fVar93 * fStack_7fc + fVar122 * fStack_9fc) - fVar78;
    fVar90 = (*(float *)pGVar51 * local_808 + *(float *)pGVar45 * local_a08) - fVar174;
    fVar91 = (*(float *)pGVar2 * fStack_804 + *(float *)pGVar52 * fStack_a04) - fVar174;
    fVar92 = (fVar102 * fStack_800 + fVar127 * fStack_a00) - fVar174;
    fVar120 = (fVar103 * fStack_7fc + fVar128 * fStack_9fc) - fVar174;
    fVar153 = (fVar54 * local_808 + fVar114 * local_a08) - fVar109;
    fVar155 = (fVar54 * fStack_804 + fVar114 * fStack_a04) - fVar109;
    fVar162 = (fVar55 * fStack_800 + fVar115 * fStack_a00) - fVar109;
    fVar168 = (fVar55 * fStack_7fc + fVar115 * fStack_9fc) - fVar109;
    fVar55 = (fVar77 * local_808 + fVar121 * local_a08) - fVar78;
    fVar77 = (fVar77 * fStack_804 + fVar121 * fStack_a04) - fVar78;
    fVar114 = (fVar100 * fStack_800 + fVar125 * fStack_a00) - fVar78;
    fVar100 = (fVar100 * fStack_7fc + fVar125 * fStack_9fc) - fVar78;
    fVar135 = (fVar102 * local_808 + fVar127 * local_a08) - fVar174;
    fVar136 = (fVar102 * fStack_804 + fVar127 * fStack_a04) - fVar174;
    fVar138 = (fVar110 * fStack_800 + fVar130 * fStack_a00) - fVar174;
    fVar140 = (fVar110 * fStack_7fc + fVar130 * fStack_9fc) - fVar174;
    fVar173 = (*(float *)pGVar19 * local_808 + *(float *)pGVar3 * local_a08) - fVar109;
    fVar175 = (fVar111 * fStack_804 + fVar108 * fStack_a04) - fVar109;
    fVar176 = (fVar111 * fStack_800 + fVar108 * fStack_a00) - fVar109;
    fVar109 = (fVar75 * fStack_7fc + fVar116 * fStack_9fc) - fVar109;
    fVar111 = ((float)local_b48 * local_808 + *(float *)pGVar4 * local_a08) - fVar78;
    fVar75 = (local_b48._4_4_ * fStack_804 + fVar122 * fStack_a04) - fVar78;
    fVar152 = (fVar93 * fStack_800 + fVar122 * fStack_a00) - fVar78;
    fVar78 = (fVar101 * fStack_7fc + fVar124 * fStack_9fc) - fVar78;
    fVar170 = (old_t_1 * local_808 + *(float *)pGVar52 * local_a08) - fVar174;
    fVar171 = (fStack_b54 * fStack_804 + fVar128 * fStack_a04) - fVar174;
    fVar172 = (fVar103 * fStack_800 + fVar128 * fStack_a00) - fVar174;
    fVar174 = (fVar107 * fStack_7fc + fVar131 * fStack_9fc) - fVar174;
    fVar93 = fVar173 - fVar185;
    fVar102 = fVar175 - fVar187;
    fVar110 = fVar176 - fVar189;
    fVar108 = fVar109 - fVar191;
    local_a18._0_4_ = fVar111 - fVar123;
    local_a18._4_4_ = fVar75 - fVar126;
    fStack_a10 = fVar152 - fVar129;
    fStack_a0c = fVar78 - fVar132;
    fVar125 = fVar170 - fVar90;
    fVar127 = fVar171 - fVar91;
    fVar128 = fVar172 - fVar92;
    fVar130 = fVar174 - fVar120;
    fVar54 = *(float *)(ray + k * 4 + 0x60);
    fVar101 = fVar185 - fVar153;
    fVar103 = fVar187 - fVar155;
    fVar107 = fVar189 - fVar162;
    fVar115 = fVar191 - fVar168;
    fVar177 = fVar123 - fVar55;
    fVar179 = fVar126 - fVar77;
    fVar181 = fVar129 - fVar114;
    fVar183 = fVar132 - fVar100;
    fVar148 = ((float)local_a18._0_4_ * (fVar170 + fVar90) - (fVar111 + fVar123) * fVar125) * fVar15
              + ((fVar173 + fVar185) * fVar125 - (fVar170 + fVar90) * fVar93) * fVar79 +
                (fVar93 * (fVar111 + fVar123) - (fVar173 + fVar185) * (float)local_a18._0_4_) *
                fVar54;
    fVar149 = ((float)local_a18._4_4_ * (fVar171 + fVar91) - (fVar75 + fVar126) * fVar127) * fVar15
              + ((fVar175 + fVar187) * fVar127 - (fVar171 + fVar91) * fVar102) * fVar79 +
                (fVar102 * (fVar75 + fVar126) - (fVar175 + fVar187) * (float)local_a18._4_4_) *
                fVar54;
    fVar150 = (fStack_a10 * (fVar172 + fVar92) - (fVar152 + fVar129) * fVar128) * fVar15 +
              ((fVar176 + fVar189) * fVar128 - (fVar172 + fVar92) * fVar110) * fVar79 +
              (fVar110 * (fVar152 + fVar129) - (fVar176 + fVar189) * fStack_a10) * fVar54;
    fVar151 = (fStack_a0c * (fVar174 + fVar120) - (fVar78 + fVar132) * fVar130) * fVar15 +
              ((fVar109 + fVar191) * fVar130 - (fVar174 + fVar120) * fVar108) * fVar79 +
              (fVar108 * (fVar78 + fVar132) - (fVar109 + fVar191) * fStack_a0c) * fVar54;
    fVar154 = fVar90 - fVar135;
    fVar156 = fVar91 - fVar136;
    fVar163 = fVar92 - fVar138;
    fVar169 = fVar120 - fVar140;
    fStack_a04 = fVar187;
    local_a08 = fVar185;
    fStack_a00 = fVar189;
    fStack_9fc = fVar191;
    fVar178 = (fVar177 * (fVar90 + fVar135) - (fVar123 + fVar55) * fVar154) * fVar15 +
              ((fVar185 + fVar153) * fVar154 - (fVar90 + fVar135) * fVar101) * fVar79 +
              (fVar101 * (fVar123 + fVar55) - (fVar185 + fVar153) * fVar177) * fVar54;
    fVar180 = (fVar179 * (fVar91 + fVar136) - (fVar126 + fVar77) * fVar156) * fVar15 +
              ((fVar187 + fVar155) * fVar156 - (fVar91 + fVar136) * fVar103) * fVar79 +
              (fVar103 * (fVar126 + fVar77) - (fVar187 + fVar155) * fVar179) * fVar54;
    fVar182 = (fVar181 * (fVar92 + fVar138) - (fVar129 + fVar114) * fVar163) * fVar15 +
              ((fVar189 + fVar162) * fVar163 - (fVar92 + fVar138) * fVar107) * fVar79 +
              (fVar107 * (fVar129 + fVar114) - (fVar189 + fVar162) * fVar181) * fVar54;
    fVar184 = (fVar183 * (fVar120 + fVar140) - (fVar132 + fVar100) * fVar169) * fVar15 +
              ((fVar191 + fVar168) * fVar169 - (fVar120 + fVar140) * fVar115) * fVar79 +
              (fVar115 * (fVar132 + fVar100) - (fVar191 + fVar168) * fVar183) * fVar54;
    fVar131 = fVar153 - fVar173;
    fVar137 = fVar155 - fVar175;
    fVar139 = fVar162 - fVar176;
    fVar147 = fVar168 - fVar109;
    fVar116 = fVar55 - fVar111;
    fVar121 = fVar77 - fVar75;
    fVar122 = fVar114 - fVar152;
    fVar124 = fVar100 - fVar78;
    fVar186 = fVar135 - fVar170;
    fVar188 = fVar136 - fVar171;
    fVar190 = fVar138 - fVar172;
    fVar192 = fVar140 - fVar174;
    auVar87._0_4_ =
         (fVar116 * (fVar170 + fVar135) - (fVar111 + fVar55) * fVar186) * fVar15 +
         ((fVar173 + fVar153) * fVar186 - (fVar170 + fVar135) * fVar131) * fVar79 +
         (fVar131 * (fVar111 + fVar55) - (fVar173 + fVar153) * fVar116) * fVar54;
    auVar87._4_4_ =
         (fVar121 * (fVar171 + fVar136) - (fVar75 + fVar77) * fVar188) * fVar15 +
         ((fVar175 + fVar155) * fVar188 - (fVar171 + fVar136) * fVar137) * fVar79 +
         (fVar137 * (fVar75 + fVar77) - (fVar175 + fVar155) * fVar121) * fVar54;
    auVar87._8_4_ =
         (fVar122 * (fVar172 + fVar138) - (fVar152 + fVar114) * fVar190) * fVar15 +
         ((fVar176 + fVar162) * fVar190 - (fVar172 + fVar138) * fVar139) * fVar79 +
         (fVar139 * (fVar152 + fVar114) - (fVar176 + fVar162) * fVar122) * fVar54;
    auVar87._12_4_ =
         (fVar124 * (fVar174 + fVar140) - (fVar78 + fVar100) * fVar192) * fVar15 +
         ((fVar109 + fVar168) * fVar192 - (fVar174 + fVar140) * fVar147) * fVar79 +
         (fVar147 * (fVar78 + fVar100) - (fVar109 + fVar168) * fVar124) * fVar54;
    auVar97._0_4_ = fVar148 + fVar178 + auVar87._0_4_;
    auVar97._4_4_ = fVar149 + fVar180 + auVar87._4_4_;
    auVar97._8_4_ = fVar150 + fVar182 + auVar87._8_4_;
    auVar97._12_4_ = fVar151 + fVar184 + auVar87._12_4_;
    auVar67._8_4_ = fVar150;
    auVar67._0_8_ = CONCAT44(fVar149,fVar148);
    auVar67._12_4_ = fVar151;
    auVar33._4_4_ = fVar180;
    auVar33._0_4_ = fVar178;
    auVar33._8_4_ = fVar182;
    auVar33._12_4_ = fVar184;
    auVar82 = minps(auVar67,auVar33);
    auVar82 = minps(auVar82,auVar87);
    auVar166._8_4_ = fVar150;
    auVar166._0_8_ = CONCAT44(fVar149,fVar148);
    auVar166._12_4_ = fVar151;
    auVar34._4_4_ = fVar180;
    auVar34._0_4_ = fVar178;
    auVar34._8_4_ = fVar182;
    auVar34._12_4_ = fVar184;
    auVar94 = maxps(auVar166,auVar34);
    auVar94 = maxps(auVar94,auVar87);
    local_9a8 = CONCAT44(auVar97._4_4_,auVar97._0_4_);
    local_9a8 = local_9a8 & 0x7fffffff7fffffff;
    fVar111 = ABS(auVar97._0_4_) * 1.1920929e-07;
    fVar55 = ABS(auVar97._4_4_) * 1.1920929e-07;
    fVar75 = ABS(auVar97._8_4_) * 1.1920929e-07;
    fVar77 = ABS(auVar97._12_4_) * 1.1920929e-07;
    auVar167._4_4_ = -(uint)(auVar94._4_4_ <= fVar55);
    auVar167._0_4_ = -(uint)(auVar94._0_4_ <= fVar111);
    auVar167._8_4_ = -(uint)(auVar94._8_4_ <= fVar75);
    auVar167._12_4_ = -(uint)(auVar94._12_4_ <= fVar77);
    in_XMM1._0_8_ = CONCAT44(fVar55,fVar111) ^ 0x8000000080000000;
    in_XMM1._8_4_ = -fVar75;
    in_XMM1._12_4_ = -fVar77;
    auVar68._4_4_ = -(uint)(-fVar55 <= auVar82._4_4_);
    auVar68._0_4_ = -(uint)(-fVar111 <= auVar82._0_4_);
    auVar68._8_4_ = -(uint)(in_XMM1._8_4_ <= auVar82._8_4_);
    auVar68._12_4_ = -(uint)(in_XMM1._12_4_ <= auVar82._12_4_);
    auVar167 = auVar167 | auVar68;
    iVar38 = movmskps(uVar37,auVar167);
    if (iVar38 == 0) goto LAB_0072e156;
    auVar118._0_4_ = (float)local_a18._0_4_ * fVar154 - fVar177 * fVar125;
    auVar118._4_4_ = (float)local_a18._4_4_ * fVar156 - fVar179 * fVar127;
    auVar118._8_4_ = fStack_a10 * fVar163 - fVar181 * fVar128;
    auVar118._12_4_ = fStack_a0c * fVar169 - fVar183 * fVar130;
    auVar119._0_4_ = fVar177 * fVar186 - fVar116 * fVar154;
    auVar119._4_4_ = fVar179 * fVar188 - fVar121 * fVar156;
    auVar119._8_4_ = fVar181 * fVar190 - fVar122 * fVar163;
    auVar119._12_4_ = fVar183 * fVar192 - fVar124 * fVar169;
    auVar69._4_4_ = -(uint)(ABS(fVar179 * fVar127) < ABS(fVar121 * fVar156));
    auVar69._0_4_ = -(uint)(ABS(fVar177 * fVar125) < ABS(fVar116 * fVar154));
    auVar69._8_4_ = -(uint)(ABS(fVar181 * fVar128) < ABS(fVar122 * fVar163));
    auVar69._12_4_ = -(uint)(ABS(fVar183 * fVar130) < ABS(fVar124 * fVar169));
    local_8d8 = blendvps(auVar119,auVar118,auVar69);
    auVar134._0_4_ = fVar131 * fVar154 - fVar101 * fVar186;
    auVar134._4_4_ = fVar137 * fVar156 - fVar103 * fVar188;
    auVar134._8_4_ = fVar139 * fVar163 - fVar107 * fVar190;
    auVar134._12_4_ = fVar147 * fVar169 - fVar115 * fVar192;
    auVar70._4_4_ = -(uint)(ABS(fVar102 * fVar156) < ABS(fVar103 * fVar188));
    auVar70._0_4_ = -(uint)(ABS(fVar93 * fVar154) < ABS(fVar101 * fVar186));
    auVar70._8_4_ = -(uint)(ABS(fVar110 * fVar163) < ABS(fVar107 * fVar190));
    auVar70._12_4_ = -(uint)(ABS(fVar108 * fVar169) < ABS(fVar115 * fVar192));
    auVar30._4_4_ = fVar127 * fVar103 - fVar102 * fVar156;
    auVar30._0_4_ = fVar125 * fVar101 - fVar93 * fVar154;
    auVar30._8_4_ = fVar128 * fVar107 - fVar110 * fVar163;
    auVar30._12_4_ = fVar130 * fVar115 - fVar108 * fVar169;
    local_8c8 = blendvps(auVar134,auVar30,auVar70);
    auVar145._0_4_ = fVar101 * fVar116 - fVar131 * fVar177;
    auVar145._4_4_ = fVar103 * fVar121 - fVar137 * fVar179;
    auVar145._8_4_ = fVar107 * fVar122 - fVar139 * fVar181;
    auVar145._12_4_ = fVar115 * fVar124 - fVar147 * fVar183;
    auVar71._4_4_ = -(uint)(ABS(fVar103 * (float)local_a18._4_4_) < ABS(fVar137 * fVar179));
    auVar71._0_4_ = -(uint)(ABS(fVar101 * (float)local_a18._0_4_) < ABS(fVar131 * fVar177));
    auVar71._8_4_ = -(uint)(ABS(fVar107 * fStack_a10) < ABS(fVar139 * fVar181));
    auVar71._12_4_ = -(uint)(ABS(fVar115 * fStack_a0c) < ABS(fVar147 * fVar183));
    auVar32._4_4_ = fVar102 * fVar179 - fVar103 * (float)local_a18._4_4_;
    auVar32._0_4_ = fVar93 * fVar177 - fVar101 * (float)local_a18._0_4_;
    auVar32._8_4_ = fVar110 * fVar181 - fVar107 * fStack_a10;
    auVar32._12_4_ = fVar108 * fVar183 - fVar115 * fStack_a0c;
    local_8b8 = blendvps(auVar145,auVar32,auVar71);
    fVar111 = fVar15 * local_8d8._0_4_ + fVar79 * local_8c8._0_4_ + fVar54 * local_8b8._0_4_;
    fVar55 = fVar15 * local_8d8._4_4_ + fVar79 * local_8c8._4_4_ + fVar54 * local_8b8._4_4_;
    fVar75 = fVar15 * local_8d8._8_4_ + fVar79 * local_8c8._8_4_ + fVar54 * local_8b8._8_4_;
    fVar54 = fVar15 * local_8d8._12_4_ + fVar79 * local_8c8._12_4_ + fVar54 * local_8b8._12_4_;
    auVar160._0_4_ = fVar111 + fVar111;
    auVar160._4_4_ = fVar55 + fVar55;
    auVar160._8_4_ = fVar75 + fVar75;
    auVar160._12_4_ = fVar54 + fVar54;
    auVar88._0_4_ = fVar90 * local_8b8._0_4_;
    auVar88._4_4_ = fVar91 * local_8b8._4_4_;
    auVar88._8_4_ = fVar92 * local_8b8._8_4_;
    auVar88._12_4_ = fVar120 * local_8b8._12_4_;
    fVar77 = fVar185 * local_8d8._0_4_ + fVar123 * local_8c8._0_4_ + auVar88._0_4_;
    fVar93 = fVar187 * local_8d8._4_4_ + fVar126 * local_8c8._4_4_ + auVar88._4_4_;
    fVar100 = fVar189 * local_8d8._8_4_ + fVar129 * local_8c8._8_4_ + auVar88._8_4_;
    fVar101 = fVar191 * local_8d8._12_4_ + fVar132 * local_8c8._12_4_ + auVar88._12_4_;
    auVar82 = rcpps(auVar88,auVar160);
    fVar54 = auVar82._0_4_;
    fVar111 = auVar82._4_4_;
    fVar55 = auVar82._8_4_;
    fVar75 = auVar82._12_4_;
    local_8e8._0_4_ = ((1.0 - auVar160._0_4_ * fVar54) * fVar54 + fVar54) * (fVar77 + fVar77);
    local_8e8._4_4_ = ((1.0 - auVar160._4_4_ * fVar111) * fVar111 + fVar111) * (fVar93 + fVar93);
    local_8e8._8_4_ = ((1.0 - auVar160._8_4_ * fVar55) * fVar55 + fVar55) * (fVar100 + fVar100);
    local_8e8._12_4_ = ((1.0 - auVar160._12_4_ * fVar75) * fVar75 + fVar75) * (fVar101 + fVar101);
    fVar54 = *(float *)(ray + k * 4 + 0x80);
    fVar111 = *(float *)(ray + k * 4 + 0x30);
    in_XMM1._0_4_ =
         (float)(-(uint)(local_8e8._0_4_ <= fVar54 && fVar111 <= local_8e8._0_4_) & auVar167._0_4_);
    in_XMM1._4_4_ =
         (float)(-(uint)(local_8e8._4_4_ <= fVar54 && fVar111 <= local_8e8._4_4_) & auVar167._4_4_);
    in_XMM1._8_4_ =
         (float)(-(uint)(local_8e8._8_4_ <= fVar54 && fVar111 <= local_8e8._8_4_) & auVar167._8_4_);
    in_XMM1._12_4_ =
         (float)(-(uint)(local_8e8._12_4_ <= fVar54 && fVar111 <= local_8e8._12_4_) &
                auVar167._12_4_);
    iVar38 = movmskps(iVar38,in_XMM1);
    if (iVar38 == 0) goto LAB_0072e156;
    in_XMM1._0_4_ = (float)((uint)in_XMM1._0_4_ & -(uint)(auVar160._0_4_ != 0.0));
    in_XMM1._4_4_ = (float)((uint)in_XMM1._4_4_ & -(uint)(auVar160._4_4_ != 0.0));
    in_XMM1._8_4_ = (float)((uint)in_XMM1._8_4_ & -(uint)(auVar160._8_4_ != 0.0));
    in_XMM1._12_4_ = (float)((uint)in_XMM1._12_4_ & -(uint)(auVar160._12_4_ != 0.0));
    uVar37 = movmskps((uint)local_9f0,in_XMM1);
    if (uVar37 == 0) goto LAB_0072e156;
    uVar41 = *(uint *)(pGVar22 + 0x18);
    uVar16 = *(undefined4 *)(pGVar22 + 0x1c);
    pGVar20 = (context->scene->geometries).items[uVar41].ptr;
    if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_0072e156;
    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
       (pGVar20->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
      auVar82 = *(undefined1 (*) [16])local_a30;
      auVar81 = auVar82._0_12_;
      auVar94 = *(undefined1 (*) [16])(local_a30 + uVar36 * 4);
      auVar58 = auVar94._0_12_;
      if (uVar36 == 2) {
        auVar81._0_8_ = auVar82._0_8_;
        auVar81._8_4_ = auVar82._4_4_;
        auVar58._0_8_ = auVar94._0_8_;
        auVar58._8_4_ = auVar94._4_4_;
      }
      auVar82 = rcpps(auVar97,auVar97);
      fVar111 = auVar82._0_4_;
      fVar55 = auVar82._4_4_;
      fVar75 = auVar82._8_4_;
      fVar77 = auVar82._12_4_;
      fVar111 = (float)(-(uint)(1e-18 <= (float)local_9a8) &
                       (uint)(((float)DAT_01f46a60 - auVar97._0_4_ * fVar111) * fVar111 + fVar111));
      fVar55 = (float)(-(uint)(1e-18 <= local_9a8._4_4_) &
                      (uint)((DAT_01f46a60._4_4_ - auVar97._4_4_ * fVar55) * fVar55 + fVar55));
      fVar75 = (float)(-(uint)(1e-18 <= ABS(auVar97._8_4_)) &
                      (uint)((DAT_01f46a60._8_4_ - auVar97._8_4_ * fVar75) * fVar75 + fVar75));
      fVar77 = (float)(-(uint)(1e-18 <= ABS(auVar97._12_4_)) &
                      (uint)((DAT_01f46a60._12_4_ - auVar97._12_4_ * fVar77) * fVar77 + fVar77));
      auVar146._0_4_ = fVar148 * fVar111;
      auVar146._4_4_ = fVar149 * fVar55;
      auVar146._8_4_ = fVar150 * fVar75;
      auVar146._12_4_ = fVar151 * fVar77;
      auVar144 = minps(auVar146,_DAT_01f46a60);
      auVar161._0_4_ = fVar178 * fVar111;
      auVar161._4_4_ = fVar180 * fVar55;
      auVar161._8_4_ = fVar182 * fVar75;
      auVar161._12_4_ = fVar184 * fVar77;
      auVar159 = minps(auVar161,_DAT_01f46a60);
      auVar89._4_4_ = auVar81._4_4_;
      auVar99._0_8_ = auVar81._0_8_;
      auVar89._8_4_ = auVar81._8_4_;
      auVar99._8_4_ = auVar89._4_4_;
      uVar76 = auVar58._4_4_;
      auVar99._12_4_ = uVar76;
      uVar56 = auVar58._0_4_;
      auVar98._8_8_ = auVar99._8_8_;
      auVar98._0_4_ = auVar81._0_4_;
      auVar98._4_4_ = uVar56;
      auVar89._0_4_ = auVar89._4_4_;
      auVar89._12_4_ = auVar89._8_4_;
      auVar72._0_8_ = auVar58._0_8_;
      auVar72._8_4_ = uVar76;
      auVar72._12_4_ = auVar58._8_4_;
      auVar105 = pblendw(auVar98,ZEXT816(0),0xaa);
      auVar94 = pblendw(auVar89,ZEXT816(0),0xaa);
      auVar82 = pblendw(auVar72,ZEXT816(0),0xaa);
      fVar93 = auVar144._0_4_;
      fVar100 = auVar144._4_4_;
      fVar101 = auVar144._8_4_;
      fVar102 = auVar144._12_4_;
      fVar103 = auVar159._0_4_;
      fVar110 = auVar159._4_4_;
      fVar107 = auVar159._8_4_;
      fVar114 = auVar159._12_4_;
      fVar111 = ((float)DAT_01f46a60 - fVar93) - fVar103;
      fVar55 = (DAT_01f46a60._4_4_ - fVar100) - fVar110;
      fVar75 = (DAT_01f46a60._8_4_ - fVar101) - fVar107;
      fVar77 = (DAT_01f46a60._12_4_ - fVar102) - fVar114;
      local_908._0_4_ =
           (float)auVar105._0_4_ * 0.00012207031 * fVar111 +
           (float)auVar82._0_4_ * 0.00012207031 * fVar103 +
           (float)auVar94._0_4_ * 0.00012207031 * fVar93;
      local_908._4_4_ =
           (float)auVar105._4_4_ * 0.00012207031 * fVar55 +
           (float)auVar82._4_4_ * 0.00012207031 * fVar110 +
           (float)auVar94._4_4_ * 0.00012207031 * fVar100;
      local_908._8_4_ =
           (float)auVar105._8_4_ * 0.00012207031 * fVar75 +
           (float)auVar82._8_4_ * 0.00012207031 * fVar107 +
           (float)auVar94._8_4_ * 0.00012207031 * fVar101;
      local_908._12_4_ =
           (float)auVar105._12_4_ * 0.00012207031 * fVar77 +
           (float)auVar82._12_4_ * 0.00012207031 * fVar114 +
           (float)auVar94._12_4_ * 0.00012207031 * fVar102;
      in_XMM1._0_4_ =
           fVar111 * (float)(auVar98._0_4_ >> 0x10) * 0.00012207031 +
           (float)(uVar56 >> 0x10) * 0.00012207031 * fVar103 +
           (float)(auVar89._4_4_ >> 0x10) * 0.00012207031 * fVar93;
      in_XMM1._4_4_ =
           fVar55 * (float)(uVar56 >> 0x10) * 0.00012207031 +
           (float)(uVar76 >> 0x10) * 0.00012207031 * fVar110 +
           (float)(auVar89._4_4_ >> 0x10) * 0.00012207031 * fVar100;
      in_XMM1._8_4_ =
           fVar75 * (float)(auVar89._4_4_ >> 0x10) * 0.00012207031 +
           (float)(uVar76 >> 0x10) * 0.00012207031 * fVar107 +
           (float)(auVar89._8_4_ >> 0x10) * 0.00012207031 * fVar101;
      in_XMM1._12_4_ =
           fVar77 * (float)(uVar76 >> 0x10) * 0.00012207031 +
           (float)(auVar58._8_4_ >> 0x10) * 0.00012207031 * fVar114 +
           (float)(auVar89._8_4_ >> 0x10) * 0.00012207031 * fVar102;
      local_8f8 = in_XMM1;
      uVar42 = (ulong)(uVar37 & 0xff);
      uVar39 = 0;
      if (uVar42 != 0) {
        for (; ((uVar37 & 0xff) >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
        }
      }
      local_b18 = CONCAT44(uVar41,uVar41);
      local_b28 = CONCAT44(uVar16,uVar16);
      auVar82 = *local_9f8;
      local_a28 = uVar36;
      while (uVar42 != 0) {
        local_878 = *(undefined4 *)(local_908 + uVar39 * 4);
        uVar17 = *(undefined4 *)(local_8f8 + uVar39 * 4);
        *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8e8 + uVar39 * 4);
        args.context = context->user;
        local_868._4_4_ = uVar17;
        local_868._0_4_ = uVar17;
        local_868._8_4_ = uVar17;
        local_868._12_4_ = uVar17;
        local_8a8 = *(undefined4 *)(local_8d8 + uVar39 * 4);
        uVar17 = *(undefined4 *)(local_8c8 + uVar39 * 4);
        uVar18 = *(undefined4 *)(local_8b8 + uVar39 * 4);
        local_898._4_4_ = uVar17;
        local_898._0_4_ = uVar17;
        local_898._8_4_ = uVar17;
        local_898._12_4_ = uVar17;
        local_888._4_4_ = uVar18;
        local_888._0_4_ = uVar18;
        local_888._8_4_ = uVar18;
        local_888._12_4_ = uVar18;
        uStack_8a4 = local_8a8;
        uStack_8a0 = local_8a8;
        uStack_89c = local_8a8;
        uStack_874 = local_878;
        uStack_870 = local_878;
        uStack_86c = local_878;
        local_858 = local_b28;
        uStack_850 = CONCAT44(uVar16,uVar16);
        local_848 = local_b18;
        uStack_840 = CONCAT44(uVar41,uVar41);
        local_838 = (args.context)->instID[0];
        uStack_834 = local_838;
        uStack_830 = local_838;
        uStack_82c = local_838;
        local_828 = (args.context)->instPrimID[0];
        uStack_824 = local_828;
        uStack_820 = local_828;
        uStack_81c = local_828;
        args.valid = (int *)local_a48;
        args.geometryUserPtr = pGVar20->userPtr;
        args.hit = (RTCHitN *)&local_8a8;
        args.N = 4;
        local_a48 = auVar82;
        args.ray = (RTCRayN *)ray;
        if (pGVar20->occlusionFilterN != (RTCFilterFunctionN)0x0) {
          (*pGVar20->occlusionFilterN)(&args);
        }
        if (local_a48 == (undefined1  [16])0x0) {
          auVar74._8_4_ = 0xffffffff;
          auVar74._0_8_ = 0xffffffffffffffff;
          auVar74._12_4_ = 0xffffffff;
          in_XMM1 = auVar74 ^ _DAT_01f46b70;
        }
        else {
          p_Var21 = context->args->filter;
          if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
               RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
            (*p_Var21)(&args);
          }
          auVar73._0_4_ = -(uint)(local_a48._0_4_ == 0);
          auVar73._4_4_ = -(uint)(local_a48._4_4_ == 0);
          auVar73._8_4_ = -(uint)(local_a48._8_4_ == 0);
          auVar73._12_4_ = -(uint)(local_a48._12_4_ == 0);
          in_XMM1 = auVar73 ^ _DAT_01f46b70;
          auVar94 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar73);
          *(undefined1 (*) [16])(args.ray + 0x80) = auVar94;
        }
        if ((_DAT_01f46b40 & in_XMM1) != (undefined1  [16])0x0) goto LAB_0072fd26;
        *(float *)(ray + k * 4 + 0x80) = fVar54;
        uVar42 = uVar42 ^ 1L << (uVar39 & 0x3f);
        uVar39 = 0;
        if (uVar42 != 0) {
          for (; (uVar42 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
          }
        }
      }
      goto LAB_0072e156;
    }
  }
  else {
    local_7e8 = fVar77;
    fStack_7e4 = fVar103;
    fStack_7e0 = fVar107;
    fStack_7dc = fVar108;
    local_7f8 = fVar187;
    fStack_7f4 = fVar188;
    fStack_7f0 = fVar189;
    fStack_7ec = fVar190;
    auVar157._0_4_ = fVar139 * fVar93 - fVar121 * fVar176;
    auVar157._4_4_ = fVar148 * fVar100 - fVar124 * fVar179;
    auVar157._8_4_ = fVar151 * fVar101 - fVar127 * fVar182;
    auVar157._12_4_ = fVar154 * fVar102 - fVar130 * fVar185;
    auVar133._0_4_ = fVar121 * fVar122 - fVar187 * fVar93;
    auVar133._4_4_ = fVar124 * fVar125 - fVar188 * fVar100;
    auVar133._8_4_ = fVar127 * fVar128 - fVar189 * fVar101;
    auVar133._12_4_ = fVar130 * fVar131 - fVar190 * fVar102;
    auVar61._4_4_ = -(uint)(ABS(fVar124 * fVar179) < ABS(fVar188 * fVar100));
    auVar61._0_4_ = -(uint)(ABS(fVar121 * fVar176) < ABS(fVar187 * fVar93));
    auVar61._8_4_ = -(uint)(ABS(fVar127 * fVar182) < ABS(fVar189 * fVar101));
    auVar61._12_4_ = -(uint)(ABS(fVar130 * fVar185) < ABS(fVar190 * fVar102));
    auVar35._4_4_ = fVar103;
    auVar35._0_4_ = fVar77;
    auVar35._8_4_ = fVar107;
    auVar35._12_4_ = fVar108;
    local_8d8 = blendvps(auVar133,auVar157,auVar61);
    auVar113._0_4_ = fVar110 * fVar93 - fVar140 * fVar122;
    auVar113._4_4_ = fVar114 * fVar100 - fVar149 * fVar125;
    auVar113._8_4_ = fVar115 * fVar101 - fVar152 * fVar128;
    auVar113._12_4_ = fVar116 * fVar102 - fVar155 * fVar131;
    auVar62._4_4_ = -(uint)(ABS(fVar168 * fVar100) < ABS(fVar149 * fVar125));
    auVar62._0_4_ = -(uint)(ABS(fVar163 * fVar93) < ABS(fVar140 * fVar122));
    auVar62._8_4_ = -(uint)(ABS(fVar169 * fVar101) < ABS(fVar152 * fVar128));
    auVar62._12_4_ = -(uint)(ABS(fVar170 * fVar102) < ABS(fVar155 * fVar131));
    auVar29._4_4_ = fVar179 * fVar149 - fVar168 * fVar100;
    auVar29._0_4_ = fVar176 * fVar140 - fVar163 * fVar93;
    auVar29._8_4_ = fVar182 * fVar152 - fVar169 * fVar101;
    auVar29._12_4_ = fVar185 * fVar155 - fVar170 * fVar102;
    local_8c8 = blendvps(auVar113,auVar29,auVar62);
    auVar106._0_4_ = fVar163 * fVar121 - fVar140 * fVar139;
    auVar106._4_4_ = fVar168 * fVar124 - fVar149 * fVar148;
    auVar106._8_4_ = fVar169 * fVar127 - fVar152 * fVar151;
    auVar106._12_4_ = fVar170 * fVar130 - fVar155 * fVar154;
    auVar117._0_4_ = fVar140 * fVar187 - fVar110 * fVar121;
    auVar117._4_4_ = fVar149 * fVar188 - fVar114 * fVar124;
    auVar117._8_4_ = fVar152 * fVar189 - fVar115 * fVar127;
    auVar117._12_4_ = fVar155 * fVar190 - fVar116 * fVar130;
    auVar63._4_4_ = -(uint)(ABS(fVar149 * fVar148) < ABS(fVar114 * fVar124));
    auVar63._0_4_ = -(uint)(ABS(fVar140 * fVar139) < ABS(fVar110 * fVar121));
    auVar63._8_4_ = -(uint)(ABS(fVar152 * fVar151) < ABS(fVar115 * fVar127));
    auVar63._12_4_ = -(uint)(ABS(fVar155 * fVar154) < ABS(fVar116 * fVar130));
    local_8b8 = blendvps(auVar117,auVar106,auVar63);
    fVar110 = fVar15 * local_8d8._0_4_ + fVar54 * local_8c8._0_4_ + fVar111 * local_8b8._0_4_;
    fVar114 = fVar15 * local_8d8._4_4_ + fVar54 * local_8c8._4_4_ + fVar111 * local_8b8._4_4_;
    fVar115 = fVar15 * local_8d8._8_4_ + fVar54 * local_8c8._8_4_ + fVar111 * local_8b8._8_4_;
    fVar116 = fVar15 * local_8d8._12_4_ + fVar54 * local_8c8._12_4_ + fVar111 * local_8b8._12_4_;
    fVar110 = fVar110 + fVar110;
    fVar114 = fVar114 + fVar114;
    fVar115 = fVar115 + fVar115;
    fVar116 = fVar116 + fVar116;
    auVar85._0_4_ = fVar191 * local_8b8._0_4_;
    auVar85._4_4_ = fVar192 * local_8b8._4_4_;
    auVar85._8_4_ = fVar193 * local_8b8._8_4_;
    auVar85._12_4_ = fVar194 * local_8b8._12_4_;
    fVar93 = fVar138 * local_8d8._0_4_ + fVar79 * local_8c8._0_4_ + auVar85._0_4_;
    fVar100 = fVar147 * local_8d8._4_4_ + fVar90 * local_8c8._4_4_ + auVar85._4_4_;
    fVar101 = fVar150 * local_8d8._8_4_ + fVar91 * local_8c8._8_4_ + auVar85._8_4_;
    fVar102 = fVar153 * local_8d8._12_4_ + fVar92 * local_8c8._12_4_ + auVar85._12_4_;
    auVar31._4_4_ = fVar114;
    auVar31._0_4_ = fVar110;
    auVar31._8_4_ = fVar115;
    auVar31._12_4_ = fVar116;
    auVar82 = rcpps(auVar85,auVar31);
    fVar54 = auVar82._0_4_;
    fVar111 = auVar82._4_4_;
    fVar55 = auVar82._8_4_;
    fVar75 = auVar82._12_4_;
    local_8e8._0_4_ = ((1.0 - fVar110 * fVar54) * fVar54 + fVar54) * (fVar93 + fVar93);
    local_8e8._4_4_ = ((1.0 - fVar114 * fVar111) * fVar111 + fVar111) * (fVar100 + fVar100);
    local_8e8._8_4_ = ((1.0 - fVar115 * fVar55) * fVar55 + fVar55) * (fVar101 + fVar101);
    local_8e8._12_4_ = ((1.0 - fVar116 * fVar75) * fVar75 + fVar75) * (fVar102 + fVar102);
    fVar54 = *(float *)(ray + k * 4 + 0x80);
    fVar111 = *(float *)(ray + k * 4 + 0x30);
    in_XMM1._0_4_ =
         (float)(-(uint)(local_8e8._0_4_ <= fVar54 && fVar111 <= local_8e8._0_4_) & auVar142._0_4_);
    in_XMM1._4_4_ =
         (float)(-(uint)(local_8e8._4_4_ <= fVar54 && fVar111 <= local_8e8._4_4_) & auVar142._4_4_);
    in_XMM1._8_4_ =
         (float)(-(uint)(local_8e8._8_4_ <= fVar54 && fVar111 <= local_8e8._8_4_) & auVar142._8_4_);
    in_XMM1._12_4_ =
         (float)(-(uint)(local_8e8._12_4_ <= fVar54 && fVar111 <= local_8e8._12_4_) &
                auVar142._12_4_);
    iVar38 = movmskps(iVar38,in_XMM1);
    if (iVar38 == 0) goto LAB_0072effc;
    in_XMM1._0_4_ = (float)((uint)in_XMM1._0_4_ & -(uint)(fVar110 != 0.0));
    in_XMM1._4_4_ = (float)((uint)in_XMM1._4_4_ & -(uint)(fVar114 != 0.0));
    in_XMM1._8_4_ = (float)((uint)in_XMM1._8_4_ & -(uint)(fVar115 != 0.0));
    in_XMM1._12_4_ = (float)((uint)in_XMM1._12_4_ & -(uint)(fVar116 != 0.0));
    uVar41 = movmskps((int)pGVar1,in_XMM1);
    if (uVar41 == 0) goto LAB_0072effc;
    uStack_b40._0_4_ = *(uint *)(pGVar19 + 0x18);
    uStack_b50._0_4_ = *(undefined4 *)(pGVar19 + 0x1c);
    pGVar20 = (context->scene->geometries).items[(uint)uStack_b40].ptr;
    if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_0072effc;
    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
       (pGVar20->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
      auVar82 = *(undefined1 (*) [16])local_a30;
      auVar80 = auVar82._0_12_;
      auVar94 = *(undefined1 (*) [16])(local_a30 + uVar36 * 4);
      auVar57 = auVar94._0_12_;
      if (uVar36 == 2) {
        auVar80._0_8_ = auVar82._0_8_;
        auVar80._8_4_ = auVar82._4_4_;
        auVar57._0_8_ = auVar94._0_8_;
        auVar57._8_4_ = auVar94._4_4_;
      }
      auVar82 = rcpps(_local_a18,auVar35);
      fVar111 = auVar82._0_4_;
      fVar55 = auVar82._4_4_;
      fVar75 = auVar82._8_4_;
      fVar93 = auVar82._12_4_;
      fVar111 = (float)(-(uint)(1e-18 <= local_818) &
                       (uint)(((float)DAT_01f46a60 - fVar77 * fVar111) * fVar111 + fVar111));
      fVar55 = (float)(-(uint)(1e-18 <= fStack_814) &
                      (uint)((DAT_01f46a60._4_4_ - fVar103 * fVar55) * fVar55 + fVar55));
      fVar75 = (float)(-(uint)(1e-18 <= fStack_810) &
                      (uint)((DAT_01f46a60._8_4_ - fVar107 * fVar75) * fVar75 + fVar75));
      fVar77 = (float)(-(uint)(1e-18 <= fStack_80c) &
                      (uint)((DAT_01f46a60._12_4_ - fVar108 * fVar93) * fVar93 + fVar93));
      auVar143._0_4_ = fVar156 * fVar111;
      auVar143._4_4_ = fVar162 * fVar55;
      auVar143._8_4_ = fStack_a10 * fVar75;
      auVar143._12_4_ = fStack_a0c * fVar77;
      auVar144 = minps(auVar143,_DAT_01f46a60);
      auVar158._0_4_ = fVar177 * fVar111;
      auVar158._4_4_ = fVar180 * fVar55;
      auVar158._8_4_ = fVar183 * fVar75;
      auVar158._12_4_ = fVar186 * fVar77;
      auVar159 = minps(auVar158,_DAT_01f46a60);
      auVar86._4_4_ = auVar80._4_4_;
      auVar96._0_8_ = auVar80._0_8_;
      auVar86._8_4_ = auVar80._8_4_;
      auVar96._8_4_ = auVar86._4_4_;
      uVar76 = auVar57._4_4_;
      auVar96._12_4_ = uVar76;
      uVar56 = auVar57._0_4_;
      auVar95._8_8_ = auVar96._8_8_;
      auVar95._0_4_ = auVar80._0_4_;
      auVar95._4_4_ = uVar56;
      auVar86._0_4_ = auVar86._4_4_;
      auVar86._12_4_ = auVar86._8_4_;
      auVar64._0_8_ = auVar57._0_8_;
      auVar64._8_4_ = uVar76;
      auVar64._12_4_ = auVar57._8_4_;
      auVar105 = pblendw(auVar95,ZEXT816(0),0xaa);
      auVar94 = pblendw(auVar86,ZEXT816(0),0xaa);
      auVar82 = pblendw(auVar64,ZEXT816(0),0xaa);
      fVar93 = auVar144._0_4_;
      fVar100 = auVar144._4_4_;
      fVar101 = auVar144._8_4_;
      fVar102 = auVar144._12_4_;
      fVar103 = auVar159._0_4_;
      fVar110 = auVar159._4_4_;
      fVar107 = auVar159._8_4_;
      fVar114 = auVar159._12_4_;
      fVar111 = ((float)DAT_01f46a60 - fVar93) - fVar103;
      fVar55 = (DAT_01f46a60._4_4_ - fVar100) - fVar110;
      fVar75 = (DAT_01f46a60._8_4_ - fVar101) - fVar107;
      fVar77 = (DAT_01f46a60._12_4_ - fVar102) - fVar114;
      local_908._0_4_ =
           (float)auVar105._0_4_ * 0.00012207031 * fVar111 +
           (float)auVar82._0_4_ * 0.00012207031 * fVar103 +
           (float)auVar94._0_4_ * 0.00012207031 * fVar93;
      local_908._4_4_ =
           (float)auVar105._4_4_ * 0.00012207031 * fVar55 +
           (float)auVar82._4_4_ * 0.00012207031 * fVar110 +
           (float)auVar94._4_4_ * 0.00012207031 * fVar100;
      local_908._8_4_ =
           (float)auVar105._8_4_ * 0.00012207031 * fVar75 +
           (float)auVar82._8_4_ * 0.00012207031 * fVar107 +
           (float)auVar94._8_4_ * 0.00012207031 * fVar101;
      local_908._12_4_ =
           (float)auVar105._12_4_ * 0.00012207031 * fVar77 +
           (float)auVar82._12_4_ * 0.00012207031 * fVar114 +
           (float)auVar94._12_4_ * 0.00012207031 * fVar102;
      in_XMM1._0_4_ =
           fVar111 * (float)(auVar95._0_4_ >> 0x10) * 0.00012207031 +
           (float)(uVar56 >> 0x10) * 0.00012207031 * fVar103 +
           (float)(auVar86._4_4_ >> 0x10) * 0.00012207031 * fVar93;
      in_XMM1._4_4_ =
           fVar55 * (float)(uVar56 >> 0x10) * 0.00012207031 +
           (float)(uVar76 >> 0x10) * 0.00012207031 * fVar110 +
           (float)(auVar86._4_4_ >> 0x10) * 0.00012207031 * fVar100;
      in_XMM1._8_4_ =
           fVar75 * (float)(auVar86._4_4_ >> 0x10) * 0.00012207031 +
           (float)(uVar76 >> 0x10) * 0.00012207031 * fVar107 +
           (float)(auVar86._8_4_ >> 0x10) * 0.00012207031 * fVar101;
      in_XMM1._12_4_ =
           fVar77 * (float)(uVar76 >> 0x10) * 0.00012207031 +
           (float)(auVar57._8_4_ >> 0x10) * 0.00012207031 * fVar114 +
           (float)(auVar86._8_4_ >> 0x10) * 0.00012207031 * fVar102;
      local_8f8 = in_XMM1;
      uVar42 = (ulong)(uVar41 & 0xff);
      uVar39 = 0;
      if (uVar42 != 0) {
        for (; ((uVar41 & 0xff) >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
        }
      }
      local_b48 = CONCAT44((uint)uStack_b40,(uint)uStack_b40);
      uStack_b40._4_4_ = (uint)uStack_b40;
      _old_t_1 = CONCAT44((undefined4)uStack_b50,(undefined4)uStack_b50);
      uStack_b50._4_4_ = (undefined4)uStack_b50;
      auVar82 = *local_9f8;
      local_a28 = uVar36;
      while (uVar42 != 0) {
        local_878 = *(undefined4 *)(local_908 + uVar39 * 4);
        uVar16 = *(undefined4 *)(local_8f8 + uVar39 * 4);
        *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8e8 + uVar39 * 4);
        args.context = context->user;
        local_868._4_4_ = uVar16;
        local_868._0_4_ = uVar16;
        local_868._8_4_ = uVar16;
        local_868._12_4_ = uVar16;
        local_8a8 = *(undefined4 *)(local_8d8 + uVar39 * 4);
        uVar16 = *(undefined4 *)(local_8c8 + uVar39 * 4);
        uVar17 = *(undefined4 *)(local_8b8 + uVar39 * 4);
        local_898._4_4_ = uVar16;
        local_898._0_4_ = uVar16;
        local_898._8_4_ = uVar16;
        local_898._12_4_ = uVar16;
        local_888._4_4_ = uVar17;
        local_888._0_4_ = uVar17;
        local_888._8_4_ = uVar17;
        local_888._12_4_ = uVar17;
        uStack_8a4 = local_8a8;
        uStack_8a0 = local_8a8;
        uStack_89c = local_8a8;
        uStack_874 = local_878;
        uStack_870 = local_878;
        uStack_86c = local_878;
        local_858 = _old_t_1;
        uStack_850 = uStack_b50;
        local_848 = local_b48;
        uStack_840 = uStack_b40;
        local_838 = (args.context)->instID[0];
        uStack_834 = local_838;
        uStack_830 = local_838;
        uStack_82c = local_838;
        local_828 = (args.context)->instPrimID[0];
        uStack_824 = local_828;
        uStack_820 = local_828;
        uStack_81c = local_828;
        args.valid = (int *)local_a48;
        args.geometryUserPtr = pGVar20->userPtr;
        args.hit = (RTCHitN *)&local_8a8;
        args.N = 4;
        local_a48 = auVar82;
        args.ray = (RTCRayN *)ray;
        if (pGVar20->occlusionFilterN != (RTCFilterFunctionN)0x0) {
          (*pGVar20->occlusionFilterN)(&args);
        }
        if (local_a48 == (undefined1  [16])0x0) {
          auVar65._8_4_ = 0xffffffff;
          auVar65._0_8_ = 0xffffffffffffffff;
          auVar65._12_4_ = 0xffffffff;
          in_XMM1 = auVar65 ^ _DAT_01f46b70;
        }
        else {
          p_Var21 = context->args->filter;
          if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
               RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
            (*p_Var21)(&args);
          }
          auVar66._0_4_ = -(uint)(local_a48._0_4_ == 0);
          auVar66._4_4_ = -(uint)(local_a48._4_4_ == 0);
          auVar66._8_4_ = -(uint)(local_a48._8_4_ == 0);
          auVar66._12_4_ = -(uint)(local_a48._12_4_ == 0);
          in_XMM1 = auVar66 ^ _DAT_01f46b70;
          auVar94 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar66);
          *(undefined1 (*) [16])(args.ray + 0x80) = auVar94;
        }
        if ((_DAT_01f46b40 & in_XMM1) != (undefined1  [16])0x0) goto LAB_0072fd26;
        *(float *)(ray + k * 4 + 0x80) = fVar54;
        uVar42 = uVar42 ^ 1L << (uVar39 & 0x3f);
        uVar39 = 0;
        if (uVar42 != 0) {
          for (; (uVar42 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
          }
        }
      }
      goto LAB_0072effc;
    }
  }
LAB_0072fd26:
  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
  goto LAB_0072fd32;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }